

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::PixelUnpackBufferStorageTestCase::execute
          (PixelUnpackBufferStorageTestCase *this,GLuint sparse_bo_storage_flags)

{
  ulong uVar1;
  ostringstream *this_00;
  uint uVar2;
  int iVar3;
  bool bVar4;
  GLenum GVar5;
  uint uVar6;
  uchar *puVar7;
  bool bVar8;
  ulong uVar9;
  uchar *puVar10;
  uchar *puVar11;
  uint uVar12;
  uchar *puVar13;
  byte bVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uchar uVar18;
  ulong uVar19;
  uchar local_1d2;
  byte local_1d1;
  ulong local_1d0;
  PixelUnpackBufferStorageTestCase *local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  (*this->m_gl->bindBuffer)(0x88ec,this->m_sparse_bo);
  GVar5 = (*this->m_gl->getError)();
  glu::checkError(GVar5,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xd93);
  (*this->m_gl->bindTexture)(0xde1,this->m_to);
  GVar5 = (*this->m_gl->getError)();
  glu::checkError(GVar5,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xd96);
  (*this->m_gl->bindBuffer)(0x8f36,this->m_helper_bo);
  GVar5 = (*this->m_gl->getError)();
  glu::checkError(GVar5,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xd99);
  local_1d0 = 0;
  bVar14 = true;
  local_1c8 = this;
  do {
    if ((int)local_1d0 != 2) {
      if ((int)local_1d0 == 1) {
        uVar6 = this->m_page_size;
        uVar2 = this->m_texture_data_size;
        if (uVar6 <= uVar2) {
          uVar12 = 0;
          do {
            (*this->m_gl->bufferPageCommitmentARB)
                      (0x88ec,(ulong)(this->m_page_size * uVar12),(long)this->m_page_size,
                       ~(byte)uVar12 & 1);
            GVar5 = (*this->m_gl->getError)();
            glu::checkError(GVar5,"glBufferPageCommitmentARB() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                            ,0xdc0);
            if ((uVar12 & 1) == 0) {
              uVar9 = (ulong)(this->m_page_size * uVar12);
              (*this->m_gl->copyBufferSubData)(0x8f36,0x88ec,uVar9,uVar9,(long)this->m_page_size);
              GVar5 = (*this->m_gl->getError)();
              glu::checkError(GVar5,"glCopyBufferSubData() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                              ,0xdc8);
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 < uVar2 / uVar6);
        }
      }
      else {
        (*this->m_gl->bufferPageCommitmentARB)
                  (0x88ec,0,(ulong)this->m_sparse_bo_size_rounded,'\x01');
        GVar5 = (*this->m_gl->getError)();
        glu::checkError(GVar5,"glBufferPageCommitmentARB() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                        ,0xdac);
        (*this->m_gl->copyBufferSubData)(0x8f36,0x88ec,0,0,(ulong)this->m_texture_data_size);
        GVar5 = (*this->m_gl->getError)();
        glu::checkError(GVar5,"glCopyBufferSubData() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                        ,0xdb1);
      }
    }
    (*this->m_gl->texSubImage2D)
              (0xde1,0,0,0,this->m_to_width,this->m_to_height,0x1908,0x1401,this->m_to_data_zero);
    GVar5 = (*this->m_gl->getError)();
    glu::checkError(GVar5,"glTexSubImage2D() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0xde2);
    (*this->m_gl->texSubImage2D)
              (0xde1,0,0,0,this->m_to_width,this->m_to_height,0x1908,0x1401,(void *)0x0);
    GVar5 = (*this->m_gl->getError)();
    glu::checkError(GVar5,"glTexSubImage2D() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0xde9);
    memset(this->m_read_data_ptr,0xff,(ulong)this->m_texture_data_size);
    (*this->m_gl->getTexImage)(0xde1,0,0x1908,0x1401,this->m_read_data_ptr);
    GVar5 = (*this->m_gl->getError)();
    glu::checkError(GVar5,"glGetTexImage() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0xdf0);
    uVar6 = this->m_to_height;
    if (uVar6 == 0) {
      bVar8 = true;
    }
    else {
      puVar13 = this->m_read_data_ptr;
      puVar11 = this->m_texture_data_ptr;
      uVar15 = (ulong)this->m_to_width;
      bVar8 = true;
      uVar17 = 0;
      uVar16 = 0;
      uVar9 = local_1d0;
      local_1d1 = bVar14;
      do {
        bVar4 = bVar8;
        if ((bool)((int)uVar15 != 0 & bVar8)) {
          if (bVar8) {
            uVar15 = (ulong)this->m_to_width;
            uVar19 = 0;
            do {
              local_1c0 = uVar19;
              puVar10 = puVar11;
              puVar7 = puVar13;
              uVar19 = 0;
              do {
                if (((int)uVar9 == 2) ||
                   (((int)uVar9 == 1 &&
                    (((uVar19 + uVar16 & 0xffffffff) / (ulong)(uint)this->m_page_size & 1) != 0))))
                {
                  if (puVar7[uVar19] != '\0') {
                    uVar18 = '\0';
LAB_00a48a92:
                    local_1b0._0_8_ = local_1c8->m_testCtx->m_log;
                    this_00 = (ostringstream *)(local_1b0 + 8);
                    local_1b8 = uVar16;
                    std::__cxx11::ostringstream::ostringstream(this_00);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00,"Invalid texel data (channel:",0x1c);
                    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00,") found at X:",0xd);
                    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", Y:",4);
                    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00,"). Expected value:",0x12);
                    local_1d2 = uVar18;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00,(char *)&local_1d2,1);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00,", found value:",0xe);
                    local_1d2 = puVar10[uVar19];
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00,(char *)&local_1d2,1);
                    tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_1b0,
                               (EndMessageToken *)&tcu::TestLog::EndMessage);
                    std::__cxx11::ostringstream::~ostringstream(this_00);
                    std::ios_base::~ios_base(local_138);
                    uVar16 = (ulong)((int)local_1b8 + (int)uVar19 + 1);
                    puVar13 = puVar7 + uVar19 + 1;
                    puVar11 = puVar10 + uVar19 + 1;
                    uVar15 = (ulong)local_1c8->m_to_width;
                    bVar8 = false;
                    bVar4 = false;
                    uVar9 = local_1d0;
                    this = local_1c8;
                    goto LAB_00a48bc5;
                  }
                }
                else {
                  uVar18 = puVar10[uVar19];
                  if (uVar18 != puVar7[uVar19]) goto LAB_00a48a92;
                }
                uVar1 = uVar19 + 1;
              } while ((uVar19 < 3) && (uVar19 = uVar1, bVar8));
              uVar19 = local_1c0 + 1;
              iVar3 = (int)uVar16;
              if (uVar15 <= uVar19 || (bool)(bVar8 ^ 1U)) break;
              uVar16 = (ulong)(uint)((int)uVar1 + iVar3);
              puVar13 = puVar7 + uVar1;
              puVar11 = puVar10 + uVar1;
            } while (bVar8);
            bVar4 = (bool)((uVar15 <= uVar19 | bVar8 ^ 1U) & bVar8);
            puVar11 = puVar10 + uVar1;
            puVar13 = puVar7 + uVar1;
            uVar16 = (ulong)(uint)(iVar3 + (int)uVar1);
            this = local_1c8;
          }
          else {
            bVar4 = false;
          }
LAB_00a48bc5:
          uVar6 = this->m_to_height;
        }
        uVar17 = uVar17 + 1;
        bVar14 = local_1d1;
      } while ((uVar17 < uVar6) && (bVar4));
    }
    bVar14 = bVar14 & bVar8;
    (*this->m_gl->bufferPageCommitmentARB)(0x88ec,0,(ulong)this->m_sparse_bo_size_rounded,'\0');
    GVar5 = (*this->m_gl->getError)();
    glu::checkError(GVar5,"glBufferPageCommitmentARB() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0xe2b);
    uVar6 = (int)local_1d0 + 1;
    local_1d0 = (ulong)uVar6;
    if (uVar6 == 3) {
      return (bool)bVar14;
    }
  } while( true );
}

Assistant:

bool PixelUnpackBufferStorageTestCase::execute(glw::GLuint sparse_bo_storage_flags)
{
	(void)sparse_bo_storage_flags;
	bool result = true;

	m_gl.bindBuffer(GL_PIXEL_UNPACK_BUFFER, m_sparse_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

	m_gl.bindTexture(GL_TEXTURE_2D, m_to);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindTexture() call failed.");

	m_gl.bindBuffer(GL_COPY_READ_BUFFER, m_helper_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindTexture() call failed.");

	/* Run three separate iterations:
	 *
	 * a) All pages holding the source texture data are committed.
	 * b) Use a zig-zag memory page commitment layout patern.
	 * b) No pages are committed.
	 */
	for (unsigned int n_iteration = 0; n_iteration < 3; ++n_iteration)
	{
		bool result_local = true;

		/* Set up the memory page commitment & the storage contents*/
		switch (n_iteration)
		{
		case 0:
		{
			m_gl.bufferPageCommitmentARB(GL_PIXEL_UNPACK_BUFFER, 0,			 /* offset */
										 m_sparse_bo_size_rounded, GL_TRUE); /* commit */
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");

			m_gl.copyBufferSubData(GL_COPY_READ_BUFFER, GL_PIXEL_UNPACK_BUFFER, 0, /* readOffset */
								   0,											   /* writeOffset */
								   m_texture_data_size);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCopyBufferSubData() call failed.");

			break;
		}

		case 1:
		{
			const unsigned int n_pages = m_texture_data_size / m_page_size;

			for (unsigned int n_page = 0; n_page < n_pages; ++n_page)
			{
				const bool should_commit = ((n_page % 2) == 0);

				m_gl.bufferPageCommitmentARB(GL_PIXEL_UNPACK_BUFFER, m_page_size * n_page, m_page_size,
											 should_commit ? GL_TRUE : GL_FALSE);
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");

				if (should_commit)
				{
					m_gl.copyBufferSubData(GL_COPY_READ_BUFFER, GL_PIXEL_UNPACK_BUFFER,
										   m_page_size * n_page, /* readOffset */
										   m_page_size * n_page, /* writeOffset */
										   m_page_size);
					GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCopyBufferSubData() call failed.");
				}
			} /* for (all relevant memory pages) */

			break;
		}

		case 2:
		{
			/* Do nothing */
			break;
		}

		default:
		{
			TCU_FAIL("Invalid iteration index");
		}
		} /* switch (n_iteration) */

		/* Clean up the base mip-map's contents before we proceeding with updating it
		 * with data downloaded from the BO, in order to avoid situation where silently
		 * failing glTexSubImage2D() calls slip past unnoticed */
		m_gl.texSubImage2D(GL_TEXTURE_2D, 0, /* level */
						   0,				 /* xoffset */
						   0,				 /* yoffset */
						   m_to_width, m_to_height, GL_RGBA, GL_UNSIGNED_BYTE, m_to_data_zero);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glTexSubImage2D() call failed.");

		/* Update the base mip-map's contents */
		m_gl.texSubImage2D(GL_TEXTURE_2D, 0, /* level */
						   0,				 /* xoffset */
						   0,				 /* yoffset */
						   m_to_width, m_to_height, GL_RGBA, GL_UNSIGNED_BYTE, (const glw::GLvoid*)0);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glTexSubImage2D() call failed.");

		/* Read back the stored mip-map data */
		memset(m_read_data_ptr, 0xFF, m_texture_data_size);

		m_gl.getTexImage(GL_TEXTURE_2D, 0, /* level */
						 GL_RGBA, GL_UNSIGNED_BYTE, m_read_data_ptr);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetTexImage() call failed.");

		/* Verify the data */
		unsigned int n_current_tex_data_byte	= 0;
		const char*  read_data_traveller_ptr	= (const char*)m_read_data_ptr;
		const char*  texture_data_traveller_ptr = (const char*)m_texture_data_ptr;

		for (unsigned int y = 0; y < m_to_height && result_local; ++y)
		{
			for (unsigned int x = 0; x < m_to_width && result_local; ++x)
			{
				for (unsigned int n_component = 0; n_component < 4 /* rgba */ && result_local; ++n_component)
				{
					char expected_value			= 0;
					bool is_from_committed_page = true;

					if (n_iteration == 1) /* zig-zag */
					{
						is_from_committed_page = ((n_current_tex_data_byte / m_page_size) % 2) == 0;
					}
					else if (n_iteration == 2) /* no pages committed */
					{
						is_from_committed_page = false;
					}

					if (is_from_committed_page)
					{
						expected_value = *texture_data_traveller_ptr;
					}

					if ((is_from_committed_page && de::abs(expected_value - *read_data_traveller_ptr) >= 1) ||
						(!is_from_committed_page && *read_data_traveller_ptr != expected_value))
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "Invalid texel data (channel:" << n_component
										   << ")"
											  " found at X:"
										   << x << ", "
												   "Y:"
										   << y << ")."
												   " Expected value:"
										   << expected_value << ","
																" found value:"
										   << *texture_data_traveller_ptr << tcu::TestLog::EndMessage;

						result_local = false;
					}

					n_current_tex_data_byte++;
					read_data_traveller_ptr++;
					texture_data_traveller_ptr++;
				} /* for (all components) */
			}	 /* for (all columns) */
		}		  /* for (all rows) */

		result &= result_local;

		/* Clean up */
		m_gl.bufferPageCommitmentARB(GL_PIXEL_UNPACK_BUFFER, 0,			  /* offset */
									 m_sparse_bo_size_rounded, GL_FALSE); /* commit */
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");
	} /* for (three iterations) */

	return result;
}